

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.c
# Opt level: O3

void SmokeStep(Gamefield *gamefield,IntVec2 coords)

{
  uint uVar1;
  uint uVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  IntVec2 local_30;
  IntVec2 local_28;
  
  uVar5 = coords.x;
  uVar2 = coords.y;
  uVar6 = uVar2 + 1;
  local_28 = coords;
  if (-1 < (int)(uVar6 | uVar5)) {
    uVar4 = gamefield->width;
    if ((uVar5 < uVar4) && (uVar6 < gamefield->height)) {
      local_30.x = uVar5;
      local_30.y = uVar6;
      _Var3 = CheckDensity(gamefield,&local_28,&local_30);
      if (_Var3) {
        return;
      }
      uVar4 = gamefield->width;
    }
    if (((uVar5 < uVar4) && (uVar6 < gamefield->height)) &&
       (local_30.x = uVar5, local_30.y = uVar6,
       gamefield->pixels[uVar4 * uVar6 + uVar5].pixelType == Empty)) goto LAB_0013f7d4;
  }
  uVar4 = uVar5 - 1;
  if ((-1 < (int)(uVar6 | uVar4)) && (uVar1 = gamefield->width, uVar4 < uVar1)) {
    if (uVar6 < gamefield->height) {
      if (((gamefield->pixels[uVar1 * uVar6 + uVar4].pixelType == Empty) &&
          (local_30.x = uVar5 + 1, (uint)local_30.x < uVar1 && -1 < (int)(uVar6 | local_30.x))) &&
         (gamefield->pixels[uVar1 * uVar6 + local_30.x].pixelType == Empty)) {
        local_30.y = uVar6;
        if ((gamefield->simulationStep & 1) == 0) {
          local_30.x = uVar4;
        }
        goto LAB_0013f7d4;
      }
    }
    if ((uVar6 < gamefield->height) &&
       (local_30.x = uVar4, local_30.y = uVar6,
       gamefield->pixels[uVar1 * uVar6 + uVar4].pixelType == Empty)) goto LAB_0013f7d4;
  }
  uVar5 = uVar5 + 1;
  local_30.x = uVar5;
  if (((int)(uVar6 | uVar5) < 0) ||
     (((gamefield->width <= uVar5 || (gamefield->height <= uVar6)) ||
      (local_30.y = uVar6, gamefield->pixels[gamefield->width * uVar6 + uVar5].pixelType != Empty)))
     ) {
    local_30.y = uVar2;
    if ((-1 < (int)(uVar4 | uVar2)) && (uVar6 = gamefield->width, uVar4 < uVar6)) {
      if ((uVar2 < gamefield->height) && ((uVar5 < uVar6 && (-1 < (int)(uVar5 | uVar2))))) {
        if ((gamefield->pixels[uVar6 * uVar2 + uVar4].pixelType == Empty) &&
           (gamefield->pixels[uVar6 * uVar2 + uVar5].pixelType == Empty)) {
          if ((gamefield->simulationStep & 1) == 0) {
            local_30.x = uVar4;
          }
          goto LAB_0013f7d4;
        }
      }
      if ((uVar2 < gamefield->height) &&
         (local_30.x = uVar4, gamefield->pixels[uVar6 * uVar2 + uVar4].pixelType == Empty))
      goto LAB_0013f7d4;
    }
    if ((int)(uVar5 | uVar2) < 0) {
      return;
    }
    if (gamefield->width <= uVar5) {
      return;
    }
    if (gamefield->height <= uVar2) {
      return;
    }
    local_30.x = uVar5;
    if (gamefield->pixels[gamefield->width * uVar2 + uVar5].pixelType != Empty) {
      return;
    }
  }
LAB_0013f7d4:
  SwapSmokePixel(gamefield,&local_28,&local_30);
  return;
}

Assistant:

void SmokeStep(Gamefield* gamefield, IntVec2 coords) {
    struct IntVec2 new;
    new.x = coords.x;
    new.y = coords.y + 1;

    if (WithinBounds(gamefield, coords.x, coords.y + 1) && CheckDensity(gamefield, &coords, &new)) {
        return;
    }

    if (WithinBounds(gamefield, coords.x, coords.y + 1) && gamefield->pixels[(coords.y + 1) * gamefield->width + coords.x].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y += 1;
        SwapSmokePixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y + 1) &&
               gamefield->pixels[(coords.y + 1) * gamefield->width + (coords.x - 1)].pixelType == Empty
               && WithinBounds(gamefield, coords.x + 1, coords.y + 1) &&
               gamefield->pixels[(coords.y + 1) * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        if (gamefield->simulationStep % 2 == 0) {
            new.y += 1;
            new.x -= 1;
        } else {
            new.y += 1;
            new.x += 1;
        }
        SwapSmokePixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y + 1) &&
               gamefield->pixels[(coords.y + 1) * gamefield->width + (coords.x - 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y += 1;
        new.x -= 1;
        SwapSmokePixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x + 1, coords.y + 1) &&
               gamefield->pixels[(coords.y + 1) * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y += 1;
        new.x += 1;
        SwapSmokePixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x - 1)].pixelType == Empty
               && WithinBounds(gamefield, coords.x + 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        if (gamefield->simulationStep % 2 == 0) {
            new.x -= 1;
        } else {
            new.x += 1;
        }
        SwapSmokePixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x - 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.x -= 1;
        SwapSmokePixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x + 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.x += 1;
        SwapSmokePixel(gamefield, &coords, &new);
    }
}